

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

void __thiscall gjkepa2_impl::EPA::Initialize(EPA *this)

{
  U UVar1;
  sFace *psVar2;
  sFace *psVar3;
  long lVar4;
  
  this->m_status = Failed;
  this->m_nextsv = 0;
  (this->m_normal).m_floats[0] = 0.0;
  (this->m_normal).m_floats[1] = 0.0;
  (this->m_normal).m_floats[2] = 0.0;
  (this->m_normal).m_floats[3] = 0.0;
  this->m_depth = 0.0;
  UVar1 = (this->m_stock).count;
  psVar3 = this->m_fc_store + 0xff;
  lVar4 = 0x100;
  do {
    psVar3->l[0] = (sFace *)0x0;
    psVar2 = (this->m_stock).root;
    psVar3->l[1] = psVar2;
    if (psVar2 != (sFace *)0x0) {
      psVar2->l[0] = psVar3;
    }
    (this->m_stock).root = psVar3;
    psVar3 = psVar3 + -1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  (this->m_stock).count = UVar1 + 0x100;
  return;
}

Assistant:

void Initialize()
	{
		m_status = eStatus::Failed;
		m_normal = cbtVector3(0, 0, 0);
		m_depth = 0;
		m_nextsv = 0;
		for (U i = 0; i < EPA_MAX_FACES; ++i)
		{
			append(m_stock, &m_fc_store[EPA_MAX_FACES - i - 1]);
		}
	}